

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int nghttp2_session_on_window_update_received(nghttp2_session *session,nghttp2_frame *frame)

{
  nghttp2_map_key_type key;
  uint uVar1;
  nghttp2_on_frame_recv_callback p_Var2;
  int iVar3;
  nghttp2_stream *stream;
  int iVar4;
  char *reason;
  
  key = (frame->hd).stream_id;
  if (key == 0) {
    uVar1 = (frame->rst_stream).error_code;
    if (uVar1 != 0) {
      if (session->remote_window_size <= (int)(uVar1 ^ 0x7fffffff)) {
        session->remote_window_size = session->remote_window_size + uVar1;
LAB_0064cd37:
        p_Var2 = (session->callbacks).on_frame_recv_callback;
        if ((p_Var2 != (nghttp2_on_frame_recv_callback)0x0) &&
           (iVar3 = (*p_Var2)(session,frame,session->user_data), iVar3 != 0)) {
          return -0x386;
        }
        return 0;
      }
      iVar3 = -0x20c;
      reason = (char *)0x0;
      goto LAB_0064cda9;
    }
LAB_0064cd97:
    reason = "WINDOW_UPDATE: window_size_increment == 0";
  }
  else {
    if ((session->server == '\0') == (bool)((byte)key & 1)) {
      iVar3 = session->last_sent_stream_id;
    }
    else {
      iVar3 = session->last_recv_stream_id;
    }
    if (iVar3 < key) {
      reason = "WINDOW_UPDATE to idle stream";
    }
    else {
      stream = (nghttp2_stream *)nghttp2_map_find(&session->streams,key);
      if (stream == (nghttp2_stream *)0x0) {
        return 0;
      }
      if ((stream->flags & 2) != 0) {
        return 0;
      }
      if (stream->state == NGHTTP2_STREAM_IDLE) {
        return 0;
      }
      if ((stream->state != NGHTTP2_STREAM_RESERVED) ||
         ((stream->stream_id != 0 &&
          ((session->server == '\0') == (bool)((byte)stream->stream_id & 1))))) {
        uVar1 = (frame->priority).pri_spec.stream_id;
        if (uVar1 != 0) {
          iVar3 = stream->remote_window_size;
          if ((int)(uVar1 ^ 0x7fffffff) < iVar3) {
            iVar3 = session_handle_invalid_stream2(session,(frame->hd).stream_id,frame,-0x20c);
            return iVar3;
          }
          iVar4 = iVar3 + uVar1;
          stream->remote_window_size = iVar4;
          if (((iVar4 != 0 && SCARRY4(iVar3,uVar1) == iVar4 < 0) &&
              (iVar3 = nghttp2_stream_check_deferred_by_flow_control(stream), iVar3 != 0)) &&
             (iVar3 = session_resume_deferred_stream_item(session,stream,'\x04'), iVar3 < -900)) {
            return iVar3;
          }
          goto LAB_0064cd37;
        }
        goto LAB_0064cd97;
      }
      reason = "WINDOW_UPADATE to reserved stream";
    }
  }
  iVar3 = -0x1f9;
LAB_0064cda9:
  iVar3 = session_handle_invalid_connection(session,frame,iVar3,reason);
  return iVar3;
}

Assistant:

int nghttp2_session_on_window_update_received(nghttp2_session *session,
                                              nghttp2_frame *frame) {
  if (frame->hd.stream_id == 0) {
    return session_on_connection_window_update_received(session, frame);
  } else {
    return session_on_stream_window_update_received(session, frame);
  }
}